

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_from_bytes(uchar *bytes,size_t len,wally_psbt **output)

{
  wally_psbt_input *pwVar1;
  wally_map_item *stack;
  wally_psbt_output *pwVar2;
  wally_psbt_input *pwVar3;
  wally_map *output_00;
  wally_psbt_input *pwVar4;
  wally_psbt_input *pwVar5;
  wally_psbt_input *pwVar6;
  wally_psbt_input *pwVar7;
  wally_psbt_input *pwVar8;
  wally_psbt_input *pwVar9;
  _Bool _Var10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint32_t uVar14;
  uchar *puVar15;
  uint64_t uVar16;
  size_t sVar17;
  uint64_t uVar18;
  wally_tx *pwVar19;
  wally_psbt_input *pwVar20;
  _func_int_uchar_ptr_size_t *in_R9;
  uint uVar21;
  uint uVar22;
  size_t in_stack_fffffffffffffeb0;
  uchar *val;
  size_t val_max;
  wally_tx *tx;
  uchar *key;
  size_t val_max_1;
  uchar *val_1;
  wally_psbt_input *local_e8;
  uchar *bytes_local;
  wally_psbt *result;
  size_t len_local;
  wally_psbt_input *local_c8;
  wally_map *local_c0;
  wally_map *local_b8;
  wally_psbt_input *local_b0;
  wally_psbt_input *local_a8;
  wally_psbt_input *local_a0;
  wally_psbt_input *local_98;
  wally_psbt_input *local_90;
  wally_psbt_input *local_88;
  size_t key_len;
  wally_psbt_input *local_78;
  wally_psbt_input *local_70;
  wally_psbt **local_68;
  size_t local_60;
  size_t value_len;
  size_t asset_len;
  uchar *nonce;
  uchar *value;
  uchar *asset;
  
  result = (wally_psbt *)0x0;
  if (output == (wally_psbt **)0x0) {
    return -2;
  }
  *output = (wally_psbt *)0x0;
  bytes_local = bytes;
  len_local = len;
  puVar15 = pull_skip(&bytes_local,&len_local,5);
  iVar13 = -2;
  if (puVar15 != (uchar *)0x0) {
    iVar11 = bcmp(puVar15,PSBT_MAGIC,5);
    if (iVar11 == 0) {
      uVar21 = 8;
      uVar22 = 0;
    }
    else {
      iVar12 = bcmp(puVar15,PSET_MAGIC,5);
      if (iVar12 != 0) goto LAB_00104231;
      uVar21 = 0;
      uVar22 = 2;
    }
    iVar13 = wally_psbt_init_alloc(0,0,0,8,&result);
    if (iVar13 == 0) {
      local_88 = (wally_psbt_input *)CONCAT44(local_88._4_4_,iVar11);
      result->magic[4] = puVar15[4];
      *(undefined4 *)result->magic = *(undefined4 *)puVar15;
      local_c0 = (wally_map *)CONCAT44(local_c0._4_4_,uVar22);
      local_68 = output;
      do {
        while( true ) {
          puVar15 = bytes_local;
          key_len = pull_varlength(&bytes_local,&len_local);
          if (key_len == 0) {
            iVar13 = -2;
            if ((bytes_local == (uchar *)0x0) || (pwVar19 = result->tx, pwVar19 == (wally_tx *)0x0))
            goto LAB_00104231;
            pwVar20 = (wally_psbt_input *)0x0;
            goto LAB_00104497;
          }
          pull_subfield_start(&bytes_local,&len_local,key_len,&key,&key_len);
          uVar16 = pull_varint(&key,&key_len);
          if (uVar16 == 0xfb) break;
          if (uVar16 == 0) {
            subfield_nomore_end(&bytes_local,&len_local,key,key_len);
            uVar16 = pull_varint(&bytes_local,&len_local);
            pull_subfield_start(&bytes_local,&len_local,uVar16,&val,&val_max);
            iVar13 = wally_tx_from_bytes(val,val_max,uVar21 | uVar22,&tx);
            if (iVar13 != 0) goto LAB_00104231;
            iVar13 = psbt_set_global_tx(result,tx,false);
            if (iVar13 != 0) {
              wally_tx_free(tx);
              goto LAB_00104231;
            }
            pull_subfield_end(&bytes_local,&len_local,val,val_max);
          }
          else {
            iVar13 = pull_unknown_key_value(&bytes_local,&len_local,puVar15,&result->unknowns);
            if (iVar13 != 0) goto LAB_00104231;
          }
        }
        if (result->version != 0) break;
        subfield_nomore_end(&bytes_local,&len_local,key,key_len);
        uVar16 = pull_varint(&bytes_local,&len_local);
        pull_subfield_start(&bytes_local,&len_local,uVar16,&val,&val_max);
        uVar14 = pull_le32(&val,&val_max);
        result->version = uVar14;
        subfield_nomore_end(&bytes_local,&len_local,val,val_max);
      } while (result->version == 0);
LAB_001054ec:
      iVar13 = -2;
    }
  }
LAB_00104231:
  wally_psbt_free(result);
  return iVar13;
LAB_00104497:
  if (pwVar20 < (wally_psbt_input *)pwVar19->num_inputs) {
    pwVar1 = result->inputs;
    local_e8 = pwVar1 + (long)pwVar20;
    local_b0 = (wally_psbt_input *)&pwVar1[(long)pwVar20].pegin_tx;
    local_b8 = (wally_map *)&pwVar1[(long)pwVar20].final_witness;
    local_98 = (wally_psbt_input *)&pwVar1[(long)pwVar20].keypaths;
    local_a0 = (wally_psbt_input *)&pwVar1[(long)pwVar20].signatures;
    local_c8 = (wally_psbt_input *)&pwVar1[(long)pwVar20].witness_utxo;
    local_90 = (wally_psbt_input *)&pwVar1[(long)pwVar20].unknowns;
    local_a8 = pwVar20;
LAB_0010451b:
    puVar15 = bytes_local;
    key = (uchar *)pull_varlength(&bytes_local,&len_local);
    if (key == (uchar *)0x0) goto LAB_00104f15;
    pull_subfield_start(&bytes_local,&len_local,(size_t)key,(uchar **)&tx,(size_t *)&key);
    uVar16 = pull_varint((uchar **)&tx,(size_t *)&key);
    output_00 = local_b8;
    pwVar20 = local_e8;
    switch(uVar16) {
    case 0:
      if (local_e8->utxo != (wally_tx *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      uVar16 = pull_varint(&bytes_local,&len_local);
      pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
LAB_001045cb:
      iVar13 = wally_tx_from_bytes(val_1,val_max_1,(uint32_t)local_c0,&pwVar20->utxo);
      if (iVar13 != 0) goto LAB_00104231;
      pull_subfield_end(&bytes_local,&len_local,val_1,val_max_1);
      goto LAB_0010451b;
    case 1:
      if (local_c8->utxo != (wally_tx *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      uVar16 = pull_varint(&bytes_local,&len_local);
      pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
      if ((int)local_88 == 0) {
        uVar16 = pull_le64(&val_1,&val_max_1);
        uVar18 = pull_varint(&val_1,&val_max_1);
        puVar15 = pull_skip(&val_1,&val_max_1,uVar18);
        if ((uVar18 != 0) && (puVar15 != (uchar *)0x0)) {
          iVar13 = wally_tx_output_init_alloc(uVar16,puVar15,uVar18,(wally_tx_output **)local_c8);
          if (iVar13 == 0) goto LAB_001049dc;
          goto LAB_00104231;
        }
        goto LAB_001054ec;
      }
      iVar13 = pull_elements_confidential
                         (&val_1,&val_max_1,&asset,&asset_len,10,0xb,0x21,in_stack_fffffffffffffeb0)
      ;
      if (((iVar13 != 0) ||
          (iVar13 = pull_elements_confidential
                              (&val_1,&val_max_1,&value,&value_len,8,9,9,in_stack_fffffffffffffeb0),
          iVar13 != 0)) ||
         (iVar13 = pull_elements_confidential
                             (&val_1,&val_max_1,&nonce,&local_60,2,3,0x21,in_stack_fffffffffffffeb0)
         , iVar13 != 0)) goto LAB_00104231;
      uVar16 = pull_varint(&val_1,&val_max_1);
      puVar15 = pull_skip(&val_1,&val_max_1,uVar16);
      if ((uVar16 == 0) || (puVar15 == (uchar *)0x0)) goto LAB_001054ec;
      in_R9 = (_func_int_uchar_ptr_size_t *)value_len;
      in_stack_fffffffffffffeb0 = local_60;
      iVar13 = wally_tx_elements_output_init_alloc
                         (puVar15,uVar16,asset,asset_len,value,value_len,nonce,local_60,(uchar *)0x0
                          ,0,(uchar *)0x0,0,(wally_tx_output **)local_c8);
      if (iVar13 != 0) goto LAB_00104231;
      goto LAB_001049dc;
    case 2:
      pwVar20 = local_a0;
      goto LAB_00104a55;
    case 3:
      if (local_e8->sighash != 0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      uVar16 = pull_varint(&bytes_local,&len_local);
      pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
      uVar14 = pull_le32(&val_1,&val_max_1);
      pwVar20->sighash = uVar14;
LAB_001049dc:
      subfield_nomore_end(&bytes_local,&len_local,val_1,val_max_1);
      goto LAB_0010451b;
    case 4:
      if (local_e8->redeem_script != (uchar *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
      if (val == (uchar *)0x0) {
        puVar15 = (uchar *)wally_malloc(1);
        pwVar20->redeem_script = puVar15;
        goto LAB_0010451b;
      }
      iVar13 = wally_psbt_input_set_redeem_script(pwVar20,(uchar *)val_max,(size_t)val);
      break;
    case 5:
      if (local_e8->witness_script != (uchar *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
      if (val == (uchar *)0x0) {
        puVar15 = (uchar *)wally_malloc(1);
        pwVar20->witness_script = puVar15;
        goto LAB_0010451b;
      }
      iVar13 = wally_psbt_input_set_witness_script(pwVar20,(uchar *)val_max,(size_t)val);
      break;
    case 6:
      pwVar20 = local_98;
LAB_00104a55:
      iVar13 = pull_map(&bytes_local,&len_local,(uchar *)tx,(size_t)key,(wally_map *)pwVar20,in_R9);
      break;
    case 7:
      if (local_e8->final_scriptsig != (uchar *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
      if (val == (uchar *)0x0) {
        puVar15 = (uchar *)wally_malloc(1);
        pwVar20->final_scriptsig = puVar15;
        goto LAB_0010451b;
      }
      iVar13 = wally_psbt_input_set_final_scriptsig(pwVar20,(uchar *)val_max,(size_t)val);
      break;
    case 8:
      if (local_b8->items != (wally_map_item *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      uVar16 = pull_varint(&bytes_local,&len_local);
      pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
      uVar16 = pull_varint(&val_1,&val_max_1);
      iVar13 = wally_tx_witness_stack_init_alloc(uVar16,(wally_tx_witness_stack **)output_00);
      if (iVar13 != 0) goto LAB_00104231;
      sVar17 = 0;
      while( true ) {
        if (uVar16 == sVar17) break;
        uVar18 = pull_varint(&val_1,&val_max_1);
        stack = local_b8->items;
        puVar15 = pull_skip(&val_1,&val_max_1,uVar18);
        iVar13 = wally_tx_witness_stack_set((wally_tx_witness_stack *)stack,sVar17,puVar15,uVar18);
        sVar17 = sVar17 + 1;
        if (iVar13 != 0) goto LAB_00104231;
      }
      subfield_nomore_end(&bytes_local,&len_local,val_1,val_max_1);
      goto LAB_0010451b;
    default:
      if (uVar16 != 0xfc) {
switchD_0010464f_default:
        iVar13 = pull_unknown_key_value(&bytes_local,&len_local,puVar15,(wally_map *)local_90);
        break;
      }
      sVar17 = pull_varlength((uchar **)&tx,(size_t *)&key);
      _Var10 = is_elements_prefix((uchar *)tx,sVar17);
      if (!_Var10) goto switchD_0010464f_default;
      pull_skip((uchar **)&tx,(size_t *)&key,8);
      uVar16 = pull_varint((uchar **)&tx,(size_t *)&key);
      pwVar20 = local_b0;
      pwVar1 = local_e8;
      switch(uVar16) {
      case 0:
        if (local_e8->has_value != 0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        uVar16 = pull_varint(&bytes_local,&len_local);
        pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
        uVar16 = pull_le64(&val_1,&val_max_1);
        pwVar1->value = uVar16;
        subfield_nomore_end(&bytes_local,&len_local,val_1,val_max_1);
        pwVar1->has_value = 1;
        goto LAB_0010451b;
      case 1:
        if (local_e8->vbf != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val == (uchar *)0x0) {
          puVar15 = (uchar *)wally_malloc(1);
          pwVar1->vbf = puVar15;
          goto LAB_0010451b;
        }
        iVar13 = wally_psbt_input_set_vbf(pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 2:
        if (local_e8->asset != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val == (uchar *)0x0) {
          puVar15 = (uchar *)wally_malloc(1);
          pwVar1->asset = puVar15;
          goto LAB_0010451b;
        }
        iVar13 = wally_psbt_input_set_asset(pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 3:
        if (local_e8->abf != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val == (uchar *)0x0) {
          puVar15 = (uchar *)wally_malloc(1);
          pwVar1->abf = puVar15;
          goto LAB_0010451b;
        }
        iVar13 = wally_psbt_input_set_abf(pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 4:
        if (local_b0->utxo == (wally_tx *)0x0) {
          subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
          uVar16 = pull_varint(&bytes_local,&len_local);
          pull_subfield_start(&bytes_local,&len_local,uVar16,&val_1,&val_max_1);
          goto LAB_001045cb;
        }
        goto LAB_001054ec;
      case 5:
        if (local_e8->txoutproof != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val == (uchar *)0x0) {
          puVar15 = (uchar *)wally_malloc(1);
          pwVar1->txoutproof = puVar15;
          goto LAB_0010451b;
        }
        iVar13 = wally_psbt_input_set_txoutproof(pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 6:
        if (local_e8->genesis_blockhash != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val == (uchar *)0x0) {
          puVar15 = (uchar *)wally_malloc(1);
          pwVar1->genesis_blockhash = puVar15;
          goto LAB_0010451b;
        }
        iVar13 = wally_psbt_input_set_genesis_blockhash(pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 7:
        if (local_e8->claim_script != (uchar *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val != (uchar *)0x0) {
          iVar13 = wally_psbt_input_set_claim_script(pwVar1,(uchar *)val_max,(size_t)val);
          break;
        }
        puVar15 = (uchar *)wally_malloc(1);
        pwVar1->claim_script = puVar15;
        goto LAB_0010451b;
      default:
        goto switchD_0010464f_default;
      }
    }
    if (iVar13 != 0) goto LAB_00104231;
    goto LAB_0010451b;
  }
  goto LAB_00104f43;
LAB_00104f15:
  pwVar20 = (wally_psbt_input *)((long)&local_a8->utxo + 1);
  pwVar19 = result->tx;
  goto LAB_00104497;
LAB_00104f43:
  pwVar20 = (wally_psbt_input *)0x0;
LAB_00104f5c:
  if (pwVar20 < (wally_psbt_input *)pwVar19->num_outputs) {
    pwVar2 = result->outputs;
    pwVar1 = (wally_psbt_input *)(pwVar2 + (long)pwVar20);
    local_c8 = (wally_psbt_input *)&pwVar2[(long)pwVar20].nonce;
    local_90 = (wally_psbt_input *)&pwVar2[(long)pwVar20].blinding_pubkey;
    local_98 = (wally_psbt_input *)&pwVar2[(long)pwVar20].surjectionproof;
    local_a0 = (wally_psbt_input *)&pwVar2[(long)pwVar20].rangeproof;
    local_a8 = (wally_psbt_input *)&pwVar2[(long)pwVar20].abf;
    local_b0 = (wally_psbt_input *)&pwVar2[(long)pwVar20].asset_commitment;
    local_70 = (wally_psbt_input *)&pwVar2[(long)pwVar20].vbf;
    local_78 = (wally_psbt_input *)&pwVar2[(long)pwVar20].value_commitment;
    local_c0 = &pwVar2[(long)pwVar20].keypaths;
    local_88 = (wally_psbt_input *)&pwVar2[(long)pwVar20].witness_script;
    local_b8 = &pwVar2[(long)pwVar20].unknowns;
    local_e8 = pwVar20;
LAB_00105025:
    puVar15 = bytes_local;
    key = (uchar *)pull_varlength(&bytes_local,&len_local);
    if (key == (uchar *)0x0) goto LAB_001054b0;
    pull_subfield_start(&bytes_local,&len_local,(size_t)key,(uchar **)&tx,(size_t *)&key);
    uVar16 = pull_varint((uchar **)&tx,(size_t *)&key);
    pwVar20 = local_88;
    if (uVar16 == 0xfc) {
      sVar17 = pull_varlength((uchar **)&tx,(size_t *)&key);
      _Var10 = is_elements_prefix((uchar *)tx,sVar17);
      if (!_Var10) {
switchD_001051a4_default:
        iVar13 = pull_unknown_key_value(&bytes_local,&len_local,puVar15,local_b8);
        goto LAB_00105215;
      }
      pull_skip((uchar **)&tx,(size_t *)&key,8);
      uVar16 = pull_varint((uchar **)&tx,(size_t *)&key);
      pwVar9 = local_70;
      pwVar20 = local_78;
      pwVar8 = local_90;
      pwVar7 = local_98;
      pwVar6 = local_a0;
      pwVar5 = local_a8;
      pwVar4 = local_b0;
      pwVar3 = local_c8;
      switch(uVar16) {
      case 0:
        if (local_78->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        if (val != (uchar *)0x0) {
          iVar13 = wally_psbt_output_set_value_commitment
                             ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
          break;
        }
LAB_001054a0:
        pwVar19 = (wally_tx *)wally_malloc(1);
        pwVar20->utxo = pwVar19;
        goto LAB_00105025;
      case 1:
        if (local_70->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar9;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_vbf((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val)
        ;
        break;
      case 2:
        if (local_b0->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar4;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_asset_commitment
                           ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 3:
        if (local_a8->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar5;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_abf((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val)
        ;
        break;
      case 4:
        if (local_a0->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar6;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_rangeproof
                           ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 5:
        if (local_98->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar7;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_surjectionproof
                           ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 6:
        if (local_90->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar8;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_blinding_pubkey
                           ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
        break;
      case 7:
        if (local_c8->utxo != (wally_tx *)0x0) goto LAB_001054ec;
        subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
        fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
        pwVar20 = pwVar3;
        if (val == (uchar *)0x0) goto LAB_001054a0;
        iVar13 = wally_psbt_output_set_nonce
                           ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
        break;
      default:
        goto switchD_001051a4_default;
      }
    }
    else if (uVar16 == 1) {
      if (local_88->utxo != (wally_tx *)0x0) goto LAB_001054ec;
      subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
      fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
      if (val == (uchar *)0x0) goto LAB_001054a0;
      iVar13 = wally_psbt_output_set_witness_script
                         ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
    }
    else {
      if (uVar16 != 2) {
        if (uVar16 != 0) goto switchD_001051a4_default;
        if (pwVar1->utxo == (wally_tx *)0x0) {
          subfield_nomore_end(&bytes_local,&len_local,(uchar *)tx,(size_t)key);
          fetch_varlength_ptr((uchar **)&val_max,(size_t *)&val,&bytes_local,&len_local);
          pwVar20 = pwVar1;
          if (val == (uchar *)0x0) goto LAB_001054a0;
          iVar13 = wally_psbt_output_set_redeem_script
                             ((wally_psbt_output *)pwVar1,(uchar *)val_max,(size_t)val);
          goto LAB_00105215;
        }
        goto LAB_001054ec;
      }
      iVar13 = pull_map(&bytes_local,&len_local,(uchar *)tx,(size_t)key,local_c0,in_R9);
    }
LAB_00105215:
    if (iVar13 != 0) goto LAB_00104231;
    goto LAB_00105025;
  }
  if (bytes_local != (uchar *)0x0) {
    *local_68 = result;
    return 0;
  }
  goto LAB_001054ec;
LAB_001054b0:
  pwVar20 = (wally_psbt_input *)((long)&local_e8->utxo + 1);
  pwVar19 = result->tx;
  goto LAB_00104f5c;
}

Assistant:

int wally_psbt_from_bytes(const unsigned char *bytes, size_t len,
                          struct wally_psbt **output)
{
    const unsigned char *magic, *pre_key;
    int ret;
    size_t i, key_len;
    struct wally_psbt *result = NULL;
    uint32_t flags = 0, pre144flag = WALLY_TX_FLAG_PRE_BIP144;

    TX_CHECK_OUTPUT;

    magic = pull_skip(&bytes, &len, sizeof(PSBT_MAGIC));
    if (!magic) {
        ret = WALLY_EINVAL;  /* Not enough bytes */
        goto fail;
    }
    if (memcmp(magic, PSBT_MAGIC, sizeof(PSBT_MAGIC)) != 0 ) {
#ifdef BUILD_ELEMENTS
        if (memcmp(magic, PSET_MAGIC, sizeof(PSET_MAGIC)) != 0) {
            ret = WALLY_EINVAL;  /* Invalid Magic */
            goto fail;
        }
        flags |= WALLY_TX_FLAG_USE_ELEMENTS;
        pre144flag = 0;
#else
        ret = WALLY_EINVAL;  /* Invalid Magic */
        goto fail;
#endif /* BUILD_ELEMENTS */
    }

    /* Make the wally_psbt */
    if ((ret = wally_psbt_init_alloc(0, 0, 0, 8, &result)) != WALLY_OK)
        goto fail;

    /* Set the magic */
    memcpy(result->magic, magic, sizeof(PSBT_MAGIC));

    /* Read globals first */
    pre_key = bytes;
    while ((key_len = pull_varlength(&bytes, &len)) != 0) {
        const unsigned char *key, *val;
        size_t val_max;

        /* Start parsing key */
        pull_subfield_start(&bytes, &len, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_GLOBAL_UNSIGNED_TX: {
            struct wally_tx *tx;

            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            ret = wally_tx_from_bytes(val, val_max, flags | pre144flag, &tx);
            if (ret == WALLY_OK) {
                ret = psbt_set_global_tx(result, tx, false);
                if (ret != WALLY_OK)
                    wally_tx_free(tx);
            }
            if (ret != WALLY_OK)
                goto fail;
            pull_subfield_end(&bytes, &len, val, val_max);
            break;
        }
        case PSBT_GLOBAL_VERSION: {
            if (result->version > 0) {
                ret = WALLY_EINVAL;    /* Version already provided */
                goto fail;
            }
            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            result->version = pull_le32(&val, &val_max);
            subfield_nomore_end(&bytes, &len, val, val_max);
            if (result->version > WALLY_PSBT_HIGHEST_VERSION) {
                ret = WALLY_EINVAL;    /* Unsupported version number */
                goto fail;
            }
            break;
        }
        /* Unknowns */
        default: {
            ret = pull_unknown_key_value(&bytes, &len, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                goto fail;
            break;
        }
        }
        pre_key = bytes;
    }

    /* We don't technically need to test here, but it's a minor optimization */
    if (!bytes) {
        ret = WALLY_EINVAL; /* Missing global separator */
        goto fail;
    }

    if (!result->tx) {
        ret = WALLY_EINVAL; /* No global tx */
        goto fail;
    }

    /* Read inputs */
    for (i = 0; i < result->tx->num_inputs; ++i) {
        ret = pull_psbt_input(&bytes, &len, flags, &result->inputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* Read outputs */
    for (i = 0; i < result->tx->num_outputs; ++i) {
        ret = pull_psbt_output(&bytes, &len, &result->outputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* If we ran out of data anywhere, fail. */
    if (!bytes) {
        ret = WALLY_EINVAL;
        goto fail;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_psbt_free(result);
    return ret;
}